

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O1

bool __thiscall cmCTestCVS::UpdateImpl(cmCTestCVS *this)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  string *arg;
  pointer pbVar7;
  vector<const_char_*,_std::allocator<const_char_*>_> cvs_update;
  string opts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  UpdateParser out;
  UpdateParser err;
  string local_938;
  string local_910;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8f0;
  undefined1 local_8d8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b0 [14];
  char *local_7d0;
  char *local_700;
  char *local_630;
  char *local_560;
  char *local_490;
  undefined1 local_480 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458 [14];
  char *local_378;
  char *local_2a8;
  char *local_1d8;
  char *local_108;
  char *local_38;
  
  pcVar2 = (this->super_cmCTestVC).CTest;
  pcVar1 = local_8d8 + 0x10;
  local_8d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d8,"UpdateOptions","");
  cmCTest::GetCTestConfiguration(&local_910,pcVar2,(string *)local_8d8);
  if ((pointer)local_8d8._0_8_ != pcVar1) {
    operator_delete((void *)local_8d8._0_8_,local_8d8._16_8_ + 1);
  }
  if (local_910._M_string_length == 0) {
    pcVar2 = (this->super_cmCTestVC).CTest;
    local_480._0_8_ = local_480 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"CVSUpdateOptions","");
    cmCTest::GetCTestConfiguration((string *)local_8d8,pcVar2,(string *)local_480);
    std::__cxx11::string::operator=((string *)&local_910,(string *)local_8d8);
    if ((pointer)local_8d8._0_8_ != pcVar1) {
      operator_delete((void *)local_8d8._0_8_,local_8d8._16_8_ + 1);
    }
    if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
      operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
    }
    if (local_910._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_910,0,(char *)0x0,0x7fa5d1);
    }
  }
  cmSystemTools::ParseArguments(&local_8f0,&local_910);
  iVar4 = cmCTest::GetTestModel((this->super_cmCTestVC).CTest);
  if (iVar4 == 1) {
    cmCTestVC::GetNightlyTime_abi_cxx11_(&local_938,&this->super_cmCTestVC);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_938,0,(char *)0x0,0x7c34a8);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      local_480._16_8_ = *psVar6;
      local_480._24_8_ = plVar5[3];
      local_480._0_8_ = local_480 + 0x10;
    }
    else {
      local_480._16_8_ = *psVar6;
      local_480._0_8_ = (size_type *)*plVar5;
    }
    local_480._8_8_ = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append(local_480);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      local_8d8._16_8_ = *psVar6;
      local_8d8._24_8_ = plVar5[3];
      local_8d8._0_8_ = pcVar1;
    }
    else {
      local_8d8._16_8_ = *psVar6;
      local_8d8._0_8_ = (size_type *)*plVar5;
    }
    local_8d8._8_8_ = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_8f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8d8);
    if ((pointer)local_8d8._0_8_ != pcVar1) {
      operator_delete((void *)local_8d8._0_8_,local_8d8._16_8_ + 1);
    }
    if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
      operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_938._M_dataplus._M_p != &local_938.field_2) {
      operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
    }
  }
  local_938._M_dataplus._M_p = (pointer)0x0;
  local_938._M_string_length = 0;
  local_938.field_2._M_allocated_capacity = 0;
  local_8d8._0_8_ = (this->super_cmCTestVC).CommandLineTool._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_938,(char **)local_8d8);
  local_8d8._0_8_ = "-z3";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_938,(char **)local_8d8);
  local_8d8._0_8_ = "update";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_938,(char **)local_8d8);
  if (local_8f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_8f0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = local_8f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_8d8._0_8_ = (pbVar7->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_938,(char **)local_8d8);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_8f0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_8d8._0_8_ = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_938,(char **)local_8d8);
  UpdateParser::UpdateParser((UpdateParser *)local_8d8,this,"up-out> ");
  UpdateParser::UpdateParser((UpdateParser *)local_480,this,"up-err> ");
  bVar3 = cmCTestVC::RunUpdateCommand
                    (&this->super_cmCTestVC,(char **)local_938._M_dataplus._M_p,
                     (OutputParser *)local_8d8,(OutputParser *)local_480,Auto);
  local_480._0_8_ = &PTR__UpdateParser_009c35c8;
  if (local_38 != (char *)0x0) {
    operator_delete__(local_38);
  }
  if (local_108 != (char *)0x0) {
    operator_delete__(local_108);
  }
  if (local_1d8 != (char *)0x0) {
    operator_delete__(local_1d8);
  }
  if (local_2a8 != (char *)0x0) {
    operator_delete__(local_2a8);
  }
  if (local_378 != (char *)0x0) {
    operator_delete__(local_378);
  }
  local_480._0_8_ = &PTR__LineParser_009c4580;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._24_8_ != local_458) {
    operator_delete((void *)local_480._24_8_,local_458[0]._M_allocated_capacity + 1);
  }
  local_8d8._0_8_ = &PTR__UpdateParser_009c35c8;
  if (local_490 != (char *)0x0) {
    operator_delete__(local_490);
  }
  if (local_560 != (char *)0x0) {
    operator_delete__(local_560);
  }
  if (local_630 != (char *)0x0) {
    operator_delete__(local_630);
  }
  if (local_700 != (char *)0x0) {
    operator_delete__(local_700);
  }
  if (local_7d0 != (char *)0x0) {
    operator_delete__(local_7d0);
  }
  local_8d8._0_8_ = &PTR__LineParser_009c4580;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._24_8_ != local_8b0) {
    operator_delete((void *)local_8d8._24_8_,local_8b0[0]._M_allocated_capacity + 1);
  }
  if ((char **)local_938._M_dataplus._M_p != (char **)0x0) {
    operator_delete(local_938._M_dataplus._M_p,
                    local_938.field_2._M_allocated_capacity - (long)local_938._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmCTestCVS::UpdateImpl()
{
  // Get user-specified update options.
  std::string opts = this->CTest->GetCTestConfiguration("UpdateOptions");
  if (opts.empty()) {
    opts = this->CTest->GetCTestConfiguration("CVSUpdateOptions");
    if (opts.empty()) {
      opts = "-dP";
    }
  }
  std::vector<std::string> args = cmSystemTools::ParseArguments(opts);

  // Specify the start time for nightly testing.
  if (this->CTest->GetTestModel() == cmCTest::NIGHTLY) {
    args.push_back("-D" + this->GetNightlyTime() + " UTC");
  }

  // Run "cvs update" to update the work tree.
  std::vector<char const*> cvs_update;
  cvs_update.push_back(this->CommandLineTool.c_str());
  cvs_update.push_back("-z3");
  cvs_update.push_back("update");
  for (std::string const& arg : args) {
    cvs_update.push_back(arg.c_str());
  }
  cvs_update.push_back(nullptr);

  UpdateParser out(this, "up-out> ");
  UpdateParser err(this, "up-err> ");
  return this->RunUpdateCommand(cvs_update.data(), &out, &err);
}